

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

ply_type __thiscall
gvr::PLYReader::getTypeOfProperty(PLYReader *this,string *elem_name,string *prop_name)

{
  PLYElement *this_00;
  PLYProperty *pPVar1;
  PLYProperty *pPVar2;
  
  this_00 = findElement(this,elem_name);
  if (this_00 != (PLYElement *)0x0) {
    pPVar1 = PLYElement::findProperty(this_00,prop_name);
    pPVar2 = pPVar1;
    if (pPVar1 != (PLYProperty *)0x0) {
      pPVar2 = (PLYProperty *)(ulong)pPVar1->tvalue;
    }
    if (pPVar1 != (PLYProperty *)0x0) {
      return (ply_type)pPVar2;
    }
  }
  return ply_none;
}

Assistant:

ply_type PLYReader::getTypeOfProperty(const std::string &elem_name,
                                      const std::string &prop_name) const
{
  PLYElement *elem=findElement(elem_name);

  if (elem != 0)
  {
    PLYProperty *prop=elem->findProperty(prop_name);

    if (prop != 0)
    {
      return prop->getValueType();
    }
  }

  return ply_none;
}